

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCopyPixels.cpp
# Opt level: O0

void anon_unknown.dwarf_220bf2::writeCopyRead
               (string *tempDir,int w,int h,int xs,int ys,int dx,int dy)

{
  int rmode;
  int comp;
  string filename2;
  string filename1;
  int in_stack_00000438;
  int in_stack_0000043c;
  int in_stack_00000440;
  int in_stack_00000444;
  char *in_stack_00000448;
  char *in_stack_00000450;
  int in_stack_00000460;
  int in_stack_00000468;
  Compression in_stack_00000470;
  LevelRoundingMode in_stack_00000478;
  int in_stack_000004b8;
  int in_stack_000004bc;
  int in_stack_000004c0;
  int in_stack_000004c4;
  char *in_stack_000004c8;
  char *in_stack_000004d0;
  int in_stack_000004e0;
  int in_stack_000004e8;
  int in_stack_000004ec;
  Compression in_stack_000004f0;
  int in_stack_000004f4;
  LevelRoundingMode in_stack_000004f8;
  undefined4 in_stack_000004fc;
  char *in_stack_00000500;
  int in_stack_00000510;
  int in_stack_00000518;
  Compression in_stack_00000520;
  LevelRoundingMode in_stack_00000528;
  char *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  int local_84;
  int local_80;
  string local_70 [32];
  string local_50 [64];
  
  std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  for (local_80 = 0; local_80 < 10; local_80 = local_80 + 1) {
    for (local_84 = 0; local_84 < 2; local_84 = local_84 + 1) {
      std::__cxx11::string::c_str();
      std::__cxx11::string::c_str();
      writeCopyReadONE(in_stack_00000450,in_stack_00000448,in_stack_00000444,in_stack_00000440,
                       in_stack_0000043c,in_stack_00000438,in_stack_00000460,in_stack_00000468,
                       in_stack_00000470,in_stack_00000478);
      std::__cxx11::string::c_str();
      std::__cxx11::string::c_str();
      writeCopyReadMIP(in_stack_000004d0,in_stack_000004c8,in_stack_000004c4,in_stack_000004c0,
                       in_stack_000004bc,in_stack_000004b8,in_stack_000004e0,in_stack_000004e8,
                       in_stack_000004f0,in_stack_000004f8);
      std::__cxx11::string::c_str();
      std::__cxx11::string::c_str();
      writeCopyReadRIP(in_stack_00000500,(char *)CONCAT44(in_stack_000004fc,in_stack_000004f8),
                       in_stack_000004f4,in_stack_000004f0,in_stack_000004ec,in_stack_000004e8,
                       in_stack_00000510,in_stack_00000518,in_stack_00000520,in_stack_00000528);
    }
  }
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void
writeCopyRead (
    const std::string& tempDir, int w, int h, int xs, int ys, int dx, int dy)
{
    std::string filename1 = tempDir + "imf_test_copy1.exr";
    std::string filename2 = tempDir + "imf_test_copy2.exr";

    for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
    {
        for (int rmode = 0; rmode < NUM_ROUNDINGMODES; ++rmode)
        {
            writeCopyReadONE (
                filename1.c_str (),
                filename2.c_str (),
                w,
                h,
                xs,
                ys,
                dx,
                dy,
                Compression (comp),
                LevelRoundingMode (rmode));

            writeCopyReadMIP (
                filename1.c_str (),
                filename2.c_str (),
                w,
                h,
                xs,
                ys,
                dx,
                dy,
                Compression (comp),
                LevelRoundingMode (rmode));

            writeCopyReadRIP (
                filename1.c_str (),
                filename2.c_str (),
                w,
                h,
                xs,
                ys,
                dx,
                dy,
                Compression (comp),
                LevelRoundingMode (rmode));
        }
    }
}